

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.hpp
# Opt level: O1

bool Kernel::isFreeVariableOf<Kernel::Literal*>(Literal *thing,uint var)

{
  bool bVar1;
  uint uVar2;
  FormulaVarIterator fvi;
  FormulaVarIterator local_f0;
  
  FormulaVarIterator::FormulaVarIterator(&local_f0,&thing->super_Term);
  do {
    bVar1 = FormulaVarIterator::hasNext(&local_f0);
    if (!bVar1) break;
    uVar2 = FormulaVarIterator::next(&local_f0);
  } while (uVar2 != var);
  FormulaVarIterator::~FormulaVarIterator(&local_f0);
  return bVar1;
}

Assistant:

bool isFreeVariableOf(T thing, unsigned var)
{
  FormulaVarIterator fvi(thing);
  while (fvi.hasNext()) {
    if (var == fvi.next()) {
      return true;
    }
  }
  return false;
}